

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O0

Color * sf::operator+=(Color *left,Color *right)

{
  Color CVar1;
  Color *in_RDI;
  Color *in_stack_00000018;
  
  CVar1 = operator+(in_stack_00000018,left);
  *in_RDI = CVar1;
  return in_RDI;
}

Assistant:

Color& operator +=(Color& left, const Color& right)
{
    return left = left + right;
}